

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MakeCurrentPerfCase::createContexts(MakeCurrentPerfCase *this)

{
  pointer *pppvVar1;
  iterator __position;
  deUint32 dVar2;
  int iVar3;
  Library *pLVar4;
  undefined4 extraout_var;
  int iVar5;
  EGLContext context;
  EGLint attribList [3];
  void *local_50;
  vector<void*,std::allocator<void*>> *local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  if (0 < (this->m_spec).contextCount) {
    local_48 = (vector<void*,std::allocator<void*>> *)&this->m_contexts;
    iVar5 = 0;
    do {
      local_40 = 0x200003098;
      local_38 = 0x3038;
      (**pLVar4->_vptr_Library)(pLVar4,0x30a0);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar2,"bindAPI(EGL_OPENGL_ES_API)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                       ,0x17e);
      iVar3 = (*pLVar4->_vptr_Library[6])(pLVar4,this->m_display,this->m_config,0,&local_40);
      local_50 = (void *)CONCAT44(extraout_var,iVar3);
      dVar2 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar2,"eglCreateContext()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                       ,0x180);
      __position._M_current =
           (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  (local_48,__position,&local_50);
      }
      else {
        *__position._M_current = local_50;
        pppvVar1 = &(this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < (this->m_spec).contextCount);
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::createContexts (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	for (int contextNdx = 0; contextNdx < m_spec.contextCount; contextNdx++)
	{
		const EGLint attribList[] = {
			EGL_CONTEXT_CLIENT_VERSION, 2,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		EGLContext context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateContext()");

		m_contexts.push_back(context);
	}
}